

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O3

void lha_replace_path_separator(lha *lha,archive_entry *entry)

{
  size_t sVar1;
  wchar_t *pwVar2;
  size_t sVar3;
  size_t sVar4;
  
  pwVar2 = archive_entry_pathname_w(entry);
  if (pwVar2 != (wchar_t *)0x0) {
    (lha->ws).length = 0;
    sVar3 = wcslen(pwVar2);
    archive_wstrncat(&lha->ws,pwVar2,sVar3);
    pwVar2 = (lha->ws).s;
    sVar1 = (lha->ws).length;
    if (sVar1 != 0) {
      sVar4 = 0;
      do {
        if (pwVar2[sVar4] == L'\\') {
          pwVar2[sVar4] = L'/';
        }
        sVar4 = sVar4 + 1;
      } while (sVar1 != sVar4);
    }
    archive_entry_copy_pathname_w(entry,pwVar2);
  }
  pwVar2 = archive_entry_symlink_w(entry);
  if (pwVar2 != (wchar_t *)0x0) {
    (lha->ws).length = 0;
    sVar3 = wcslen(pwVar2);
    archive_wstrncat(&lha->ws,pwVar2,sVar3);
    pwVar2 = (lha->ws).s;
    sVar1 = (lha->ws).length;
    if (sVar1 != 0) {
      sVar4 = 0;
      do {
        if (pwVar2[sVar4] == L'\\') {
          pwVar2[sVar4] = L'/';
        }
        sVar4 = sVar4 + 1;
      } while (sVar1 != sVar4);
    }
    archive_entry_copy_symlink_w(entry,pwVar2);
    return;
  }
  return;
}

Assistant:

static void
lha_replace_path_separator(struct lha *lha, struct archive_entry *entry)
{
	const wchar_t *wp;
	size_t i;

	if ((wp = archive_entry_pathname_w(entry)) != NULL) {
		archive_wstrcpy(&(lha->ws), wp);
		for (i = 0; i < archive_strlen(&(lha->ws)); i++) {
			if (lha->ws.s[i] == L'\\')
				lha->ws.s[i] = L'/';
		}
		archive_entry_copy_pathname_w(entry, lha->ws.s);
	}

	if ((wp = archive_entry_symlink_w(entry)) != NULL) {
		archive_wstrcpy(&(lha->ws), wp);
		for (i = 0; i < archive_strlen(&(lha->ws)); i++) {
			if (lha->ws.s[i] == L'\\')
				lha->ws.s[i] = L'/';
		}
		archive_entry_copy_symlink_w(entry, lha->ws.s);
	}
}